

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

err_t TextPrintf(textwriter_conflict *p,tchar_t *Msg,...)

{
  char in_AL;
  err_t eVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined1 local_438 [8];
  va_list Arg;
  tchar_t local_418 [8];
  tchar_t s [1024];
  tchar_t *Msg_local;
  textwriter_conflict *p_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  Arg[0].overflow_arg_area = local_4e8;
  Arg[0]._0_8_ = &stack0x00000008;
  local_438._4_4_ = 0x30;
  local_438._0_4_ = 0x10;
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  s._1016_8_ = Msg;
  vstprintf_s(local_418,0x400,Msg,(__va_list_tag *)local_438);
  eVar1 = TextWrite(p,local_418);
  return eVar1;
}

Assistant:

err_t TextPrintf(textwriter* p, const tchar_t* Msg,...)
{
    tchar_t s[MAXLINE];
    va_list Arg;
    va_start(Arg,Msg);
    vstprintf_s(s,TSIZEOF(s),Msg,Arg);
    va_end(Arg);
    return TextWrite(p,s);
}